

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O0

void __thiscall xmrig::CudaConfig::generate(CudaConfig *this)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  String *this_00;
  EVP_PKEY_CTX *ctx;
  size_t sVar4;
  CudaConfig *in_RDI;
  size_t count;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> devices;
  int32_t in_stack_00000058;
  int32_t in_stack_0000005c;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *in_stack_ffffffffffffffc0;
  Threads<xmrig::CudaThreads> *in_stack_ffffffffffffffe0;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *in_stack_ffffffffffffffe8;
  Threads<xmrig::CudaThreads> *in_stack_fffffffffffffff0;
  
  if ((((generated & 1) == 0) && (bVar1 = isEnabled(in_RDI), bVar1)) &&
     (bVar1 = Threads<xmrig::CudaThreads>::has(in_stack_ffffffffffffffe0), !bVar1)) {
    this_00 = loader(in_RDI);
    ctx = (EVP_PKEY_CTX *)String::operator_cast_to_char_(this_00);
    uVar2 = CudaLib::init(ctx);
    if ((((uVar2 & 1) != 0) && (uVar3 = CudaLib::runtimeVersion(), uVar3 != 0)) &&
       ((uVar3 = CudaLib::driverVersion(), uVar3 != 0 &&
        (uVar3 = CudaLib::deviceCount(), uVar3 != 0)))) {
      bfactor(in_RDI);
      bsleep(in_RDI);
      CudaLib::devices(in_stack_0000005c,in_stack_00000058,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
      bVar1 = std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::empty
                        (in_stack_ffffffffffffffc0);
      if (!bVar1) {
        sVar4 = xmrig::generate(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
        generated = 1;
        in_RDI->m_shouldSave = sVar4 != 0;
      }
      std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::~vector
                (in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void xmrig::CudaConfig::generate()
{
    if (generated) {
        return;
    }

    if (!isEnabled() || m_threads.has()) {
        return;
    }

    if (!CudaLib::init(loader())) {
        return;
    }

    if (!CudaLib::runtimeVersion() || !CudaLib::driverVersion() || !CudaLib::deviceCount()) {
        return;
    }

    const auto devices = CudaLib::devices(bfactor(), bsleep(), m_devicesHint);
    if (devices.empty()) {
        return;
    }

    size_t count = 0;
    count += xmrig::generate(m_threads, devices);

    generated    = true;
    m_shouldSave = count > 0;
}